

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

void __thiscall
llama_kv_cache_unified::seq_add
          (llama_kv_cache_unified *this,llama_seq_id seq_id,llama_pos p0,llama_pos p1,
          llama_pos delta)

{
  int iVar1;
  _Base_ptr p_Var2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  uint uVar8;
  _Rb_tree_header *p_Var9;
  pointer plVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  if (delta != 0) {
    iVar13 = 0;
    if (0 < p0) {
      iVar13 = p0;
    }
    iVar11 = 0x7fffffff;
    if ((uint)p1 < 0x7fffffff) {
      iVar11 = p1;
    }
    if (iVar13 != iVar11) {
      uVar8 = this->size;
      if (this->recurrent == false) {
        uVar3 = this->size;
        if (uVar3 != 0) {
          uVar12 = 0;
          do {
            plVar10 = (this->cells).
                      super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
                      super__Vector_impl_data._M_start;
            p_Var6 = (_Rb_tree_header *)((long)&plVar10[uVar12].seq_id._M_t._M_impl + 8);
            p_Var7 = (_Base_ptr)p_Var6;
            for (p_Var2 = *(_Base_ptr *)((long)&plVar10[uVar12].seq_id._M_t._M_impl + 0x10);
                (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
                p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < seq_id]) {
              if (seq_id <= (int)*(size_t *)(p_Var2 + 1)) {
                p_Var7 = p_Var2;
              }
            }
            p_Var9 = p_Var6;
            if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
               (p_Var9 = (_Rb_tree_header *)p_Var7,
               seq_id < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
              p_Var9 = p_Var6;
            }
            if (p_Var9 != p_Var6) {
              plVar10 = plVar10 + uVar12;
              iVar1 = plVar10->pos;
              if (iVar1 < iVar11 && iVar13 <= iVar1) {
                this->has_shift = true;
                plVar10->delta = plVar10->delta + delta;
                plVar10->pos = iVar1 + delta;
                if (iVar1 + delta < 0) {
                  if (*(size_t *)((long)&(plVar10->seq_id)._M_t._M_impl + 0x28) != 0) {
                    this->used = this->used - 1;
                  }
                  plVar10->pos = -1;
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::clear(&(plVar10->seq_id)._M_t);
                  if (uVar8 == this->size) {
                    uVar8 = (uint)uVar12;
                  }
                }
              }
            }
            uVar12 = uVar12 + 1;
            uVar3 = this->size;
          } while (uVar12 < uVar3);
        }
        uVar4 = 0;
        if (uVar8 != uVar3) {
          uVar4 = uVar8;
        }
        this->head = uVar4;
      }
      else if ((uint)seq_id < uVar8 && -1 < seq_id) {
        plVar10 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)plVar10[(uint)seq_id].tail;
        if (-1 < lVar5) {
          p_Var6 = (_Rb_tree_header *)((long)&plVar10[lVar5].seq_id._M_t._M_impl + 8);
          p_Var7 = (_Base_ptr)p_Var6;
          for (p_Var2 = *(_Base_ptr *)((long)&plVar10[lVar5].seq_id._M_t._M_impl + 0x10);
              (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
              p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < seq_id]) {
            if (seq_id <= (int)*(size_t *)(p_Var2 + 1)) {
              p_Var7 = p_Var2;
            }
          }
          p_Var9 = p_Var6;
          if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
             (p_Var9 = (_Rb_tree_header *)p_Var7,
             seq_id < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var9 = p_Var6;
          }
          if (p_Var9 != p_Var6) {
            iVar1 = plVar10[lVar5].pos;
            if (iVar1 < iVar11 && iVar13 <= iVar1) {
              plVar10[lVar5].pos = iVar1 + delta;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llama_kv_cache_unified::seq_add(llama_seq_id seq_id, llama_pos p0, llama_pos p1, llama_pos delta) {
    if (delta == 0) {
        return;
    }

    uint32_t new_head = size;

    if (p0 < 0) {
        p0 = 0;
    }

    if (p1 < 0) {
        p1 = std::numeric_limits<llama_pos>::max();
    }

    // If there is no range then return early to avoid looping over the
    if (p0 == p1) {
        return;
    }

    if (recurrent) {
        // for Mamba-like or RWKV models, only the pos needs to be shifted
        if (0 <= seq_id && seq_id < (int64_t) size) {
            const int32_t tail_id = cells[seq_id].tail;
            if (tail_id >= 0) {
                llama_kv_cell & cell = cells[tail_id];
                if (cell.has_seq_id(seq_id) && p0 <= cell.pos && cell.pos < p1) {
                    cell.pos += delta;
                }
            }
        }
        return;
    }

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id) && cells[i].pos >= p0 && cells[i].pos < p1) {
            has_shift = true;
            cells[i].pos   += delta;
            cells[i].delta += delta;

            if (cells[i].pos < 0) {
                if (!cells[i].is_empty()) {
                    used--;
                }
                cells[i].pos = -1;
                cells[i].seq_id.clear();
                if (new_head == size) {
                    new_head = i;
                }
            }
        }
    }

    // If we freed up a slot, set head to it so searching can start there.
    // Otherwise we just start the next search from the beginning.
    head = new_head != size ? new_head : 0;
}